

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall NoiseShape::NoiseShape(NoiseShape *this,double *coeff,int taps)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->mCoeff = coeff;
  this->mTaps = taps;
  this->mErrPtr = 0;
  uVar4 = 0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < taps) {
    uVar3 = (ulong)(uint)taps << 3;
  }
  uVar2 = (ulong)(uint)taps;
  if (taps < 1) {
    uVar2 = uVar4;
  }
  pdVar1 = (double *)operator_new__(uVar3);
  this->mErr = pdVar1;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    pdVar1[uVar4] = 0.0;
  }
  return;
}

Assistant:

NoiseShape(const double *coeff, int taps) {
		mCoeff = coeff;
		mTaps = taps;
		mErrPtr = 0;
		mErr = new double[taps];
		for (int i=0; i<taps; ++i) {
			mErr[i] = .0;
		}
	}